

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  undefined8 *in_RSI;
  int in_EDI;
  clock_t finish;
  thread reader;
  thread writer;
  clock_t start;
  _func_int *in_stack_ffffffffffffffc8;
  thread *in_stack_ffffffffffffffd0;
  
  if (1 < in_EDI) {
    g_maxCount = atoi((char *)in_RSI[1]);
  }
  cVar1 = clock();
  std::thread::thread<int(&)(),,void>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::thread::thread<int(&)(),,void>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::thread::join();
  std::thread::join();
  cVar2 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,(char *)*in_RSI);
  poVar3 = std::operator<<(poVar3,"  duration:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cVar2 - cVar1);
  poVar3 = std::operator<<(poVar3,"ms");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::thread::~thread((thread *)0x10347e);
  std::thread::~thread((thread *)0x103488);
  return 0;
}

Assistant:

int main(int argc,char *argv[])
{
    if (argc >=2 ){
	g_maxCount = atoi(argv[1]); 
	//printf("max count is %d\n",g_maxCount); 
    }


    clock_t start = clock();

    std::thread writer(write_proc); 
    std::thread reader(read_proc); 
    reader.join(); 
    writer.join(); 

    clock_t finish = clock();
    std::cout<<argv[0] << "  duration:"<<finish - start<<"ms"<<std::endl;
    return 0; 

}